

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FalseTargetsAttribute.cpp
# Opt level: O1

int __thiscall DIS::FalseTargetsAttribute::getMarshalledSize(FalseTargetsAttribute *this)

{
  return 0x28;
}

Assistant:

int FalseTargetsAttribute::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _recordType
   marshalSize = marshalSize + 2;  // _recordLength
   marshalSize = marshalSize + 2;  // _padding
   marshalSize = marshalSize + 1;  // _emitterNumber
   marshalSize = marshalSize + 1;  // _beamNumber
   marshalSize = marshalSize + 1;  // _stateIndicator
   marshalSize = marshalSize + 1;  // _padding2
   marshalSize = marshalSize + 4;  // _falseTargetCount
   marshalSize = marshalSize + 4;  // _walkSpeed
   marshalSize = marshalSize + 4;  // _walkAcceleration
   marshalSize = marshalSize + 4;  // _maximumWalkDistance
   marshalSize = marshalSize + 4;  // _keepTime
   marshalSize = marshalSize + 4;  // _echoSpacing
   marshalSize = marshalSize + 4;  // _padding3
    return marshalSize;
}